

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gerr.hpp
# Opt level: O3

ostream * gerr::details::operator<<(ostream *os,IError *err)

{
  uint __val;
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  size_t sVar6;
  undefined4 extraout_var_00;
  ulong uVar7;
  uint __len;
  char *local_50;
  long local_48;
  char local_40 [16];
  char *__s;
  
  do {
    uVar2 = (*err->_vptr_IError[2])(err);
    iVar3 = (*err->_vptr_IError[3])(err);
    __s = (char *)CONCAT44(extraout_var,iVar3);
    if (__s == (char *)0x0) {
      if (uVar2 == 0) {
        std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
      }
      else {
LAB_00103a3f:
        __val = -uVar2;
        if (0 < (int)uVar2) {
          __val = uVar2;
        }
        __len = 1;
        if (9 < __val) {
          uVar7 = (ulong)__val;
          uVar1 = 4;
          do {
            __len = uVar1;
            uVar4 = (uint)uVar7;
            if (uVar4 < 100) {
              __len = __len - 2;
              goto LAB_00103ab4;
            }
            if (uVar4 < 1000) {
              __len = __len - 1;
              goto LAB_00103ab4;
            }
            if (uVar4 < 10000) goto LAB_00103ab4;
            uVar7 = uVar7 / 10000;
            uVar1 = __len + 4;
          } while (99999 < uVar4);
          __len = __len + 1;
        }
LAB_00103ab4:
        local_50 = local_40;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_50,(char)__len - (char)((int)uVar2 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>(local_50 + (uVar2 >> 0x1f),__len,__val);
        std::__ostream_insert<char,std::char_traits<char>>(os,local_50,local_48);
        if (local_50 != local_40) {
          operator_delete(local_50);
        }
      }
    }
    else {
      if ((uVar2 == 0) || (*__s == '\0')) {
        if (uVar2 != 0) goto LAB_00103a3f;
        sVar6 = strlen(__s);
        poVar5 = os;
      }
      else {
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)os,uVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
        sVar6 = strlen(__s);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s,sVar6);
    }
    iVar3 = (*err->_vptr_IError[4])(err);
    if (*(long *)CONCAT44(extraout_var_00,iVar3) == 0) {
      return os;
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,":",1);
    err = *(IError **)CONCAT44(extraout_var_00,iVar3);
  } while( true );
}

Assistant:

std::ostream& operator<<(std::ostream& os, IError const& err) {
    for (auto p = &err;;) {
      auto const c = p->Code();
      auto const msg = p->Message();
      auto const hasMsg = msg != nullptr && msg[0] != '\0';
      if (c != 0 && hasMsg) {
        // 同时持有非 0 的 code 和 message，同时打印
        os << c << ":" << msg;
      } else if (c == 0) {
        // 如果 code == 0，就只打印 message
        os << msg;
      } else {  // c != 0 && !hasMsg
        // 如果 message 是空，就只打印 code
        os << std::to_string(c);
      }
      auto const& next = p->Cause();
      if (next != nullptr) {
        os << ":";
        p = next.get();
      } else {
        break;
      }
    }
    return os;
  }